

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Utils.cpp
# Opt level: O2

bool CoreML::hasWeightOfType(Model *model,WeightParamType *wt)

{
  bool bVar1;
  RepeatedPtrFieldBase *this;
  Type *layer;
  int i;
  int index;
  bool bVar2;
  
  this = &getNNSpec(model)->super_RepeatedPtrFieldBase;
  index = 0;
  if (this == (RepeatedPtrFieldBase *)0x0) {
    bVar2 = false;
  }
  else {
    do {
      bVar2 = index < this->current_size_;
      if (this->current_size_ <= index) {
        return bVar2;
      }
      layer = google::protobuf::internal::RepeatedPtrFieldBase::
              Get<google::protobuf::RepeatedPtrField<CoreML::Specification::NeuralNetworkLayer>::TypeHandler>
                        (this,index);
      bVar1 = hasWeightOfType(layer,wt);
      index = index + 1;
    } while (!bVar1);
  }
  return bVar2;
}

Assistant:

bool CoreML::hasWeightOfType(const Specification::Model& model, const WeightParamType& wt) {
    auto layers = getNNSpec(model);
    if(layers) {
        for(int i =0; i< layers->size(); i++){
            const Specification::NeuralNetworkLayer& layer = (*layers)[i];
            if(hasWeightOfType(layer,wt)) {
                return true;
            }
        }
    }
    return false;
}